

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O2

ssize_t __thiscall
capnp::
Request<capnproto_test::capnp::test::TestKeywordMethods::DeleteParams,_capnproto_test::capnp::test::TestKeywordMethods::DeleteResults>
::send(Request<capnproto_test::capnp::test::TestKeywordMethods::DeleteParams,_capnproto_test::capnp::test::TestKeywordMethods::DeleteResults>
       *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 *puVar1;
  undefined4 in_register_00000034;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp____capnp_capability_h:769:13),_capnp::Response<capnp::AnyPointer>_>
  typedPromise;
  RemotePromise<capnp::AnyPointer> typelessPromise;
  Own<kj::_::PromiseNode> local_80;
  RemotePromise<capnp::AnyPointer> local_70;
  Pipeline local_38;
  
  puVar1 = *(undefined8 **)(CONCAT44(in_register_00000034,__fd) + 0x30);
  (**(code **)*puVar1)(&local_70,puVar1);
  kj::Own<capnp::RequestHook>::dispose
            ((Own<capnp::RequestHook> *)(CONCAT44(in_register_00000034,__fd) + 0x28));
  kj::Promise<capnp::Response<capnp::AnyPointer>>::
  then<capnp::Request<capnproto_test::capnp::test::TestKeywordMethods::DeleteParams,capnproto_test::capnp::test::TestKeywordMethods::DeleteResults>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>
            ((Promise<capnp::Response<capnp::AnyPointer>> *)&local_80,
             (anon_class_1_0_00000001_for_func *)&local_70,(PropagateException *)&local_38);
  local_38.hook.ptr = local_70.super_Pipeline.hook.ptr;
  local_70.super_Pipeline.hook.ptr = (PipelineHook *)0x0;
  local_38.hook.disposer = local_70.super_Pipeline.hook.disposer;
  local_38.ops.ptr = local_70.super_Pipeline.ops.ptr;
  local_38.ops.size_ = local_70.super_Pipeline.ops.size_;
  local_38.ops.disposer = local_70.super_Pipeline.ops.disposer;
  local_70.super_Pipeline.ops.ptr = (PipelineOp *)0x0;
  local_70.super_Pipeline.ops.size_ = 0;
  RemotePromise<capnproto_test::capnp::test::TestKeywordMethods::DeleteResults>::RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestKeywordMethods::DeleteResults> *)this,
             (Promise<capnp::Response<capnproto_test::capnp::test::TestKeywordMethods::DeleteResults>_>
              *)&local_80,(Pipeline *)&local_38);
  AnyPointer::Pipeline::~Pipeline(&local_38);
  kj::Own<kj::_::PromiseNode>::dispose(&local_80);
  RemotePromise<capnp::AnyPointer>::~RemotePromise(&local_70);
  return (ssize_t)this;
}

Assistant:

RemotePromise<Results> Request<Params, Results>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([](Response<AnyPointer>&& response) -> Response<Results> {
        return Response<Results>(response.getAs<Results>(), kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  typename Results::Pipeline typedPipeline(
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<Results>(kj::mv(typedPromise), kj::mv(typedPipeline));
}